

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O1

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  double *pdVar1;
  double dVar2;
  size_type i;
  undefined8 *puVar3;
  node_type *pnVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  node_type *pnVar8;
  size_type split_dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> split;
  scalar_type split_val;
  box_type right;
  
  lVar5 = *(long *)(this + 0x20);
  if (*(long *)(lVar5 + 0x10) == 0x100) {
    puVar3 = (undefined8 *)operator_new(0x2808);
    *puVar3 = *(undefined8 *)(lVar5 + 8);
    *(undefined8 **)(lVar5 + 8) = puVar3;
    *(undefined8 **)(lVar5 + 0x18) = puVar3 + 1;
    *(undefined8 *)(lVar5 + 0x10) = 0;
  }
  pnVar8 = (node_type *)(*(long *)(lVar5 + 0x10) * 0x28 + *(long *)(lVar5 + 0x18));
  *(long *)(lVar5 + 0x10) = *(long *)(lVar5 + 0x10) + 1;
  if ((long)*(int *)(this + 8) < (long)end._M_current - (long)begin._M_current >> 2) {
    split._M_current = (int *)0x0;
    splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>>
    ::operator()((splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,2ul>>>>
                  *)(this + 0x10),depth,begin,end,box,&split,&split_dim,&split_val);
    right.storage_.coords_min._M_elems[0] = (box->storage_).coords_min._M_elems[0];
    right.storage_.coords_min._M_elems[1] = (box->storage_).coords_min._M_elems[1];
    right.storage_.coords_max._M_elems[0] = (box->storage_).coords_max._M_elems[0];
    right.storage_.coords_max._M_elems[1] = (box->storage_).coords_max._M_elems[1];
    (box->storage_).coords_max._M_elems[split_dim] = split_val;
    right.storage_.coords_min._M_elems[split_dim] = split_val;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,depth + 1,begin,split,box);
    (pnVar8->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).
    left = pnVar4;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,depth + 1,split,end,&right);
    (pnVar8->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).
    right = pnVar4;
    (pnVar8->data).branch.split_dim = (int)split_dim;
    (pnVar8->data).branch.left_max = (box->storage_).coords_max._M_elems[split_dim];
    (pnVar8->data).branch.right_min = right.storage_.coords_min._M_elems[split_dim];
    lVar5 = 0;
    do {
      dVar2 = right.storage_.coords_min._M_elems[lVar5];
      if (dVar2 < (box->storage_).coords_min._M_elems[lVar5]) {
        (box->storage_).coords_min._M_elems[lVar5] = dVar2;
      }
      dVar2 = right.storage_.coords_max._M_elems[lVar5];
      pdVar1 = (box->storage_).coords_max._M_elems + lVar5;
      if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
        (box->storage_).coords_max._M_elems[lVar5] = dVar2;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
  }
  else {
    lVar5 = **(long **)(this + 0x18);
    (pnVar8->data).branch.split_dim = (int)((ulong)((long)begin._M_current - lVar5) >> 2);
    (pnVar8->data).leaf.end_idx = (int)((ulong)((long)end._M_current - lVar5) >> 2);
    (pnVar8->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).
    left = (kd_tree_node_euclidean<int,_double> *)0x0;
    (pnVar8->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_double>_>).
    right = (kd_tree_node_euclidean<int,_double> *)0x0;
    (box->storage_).coords_min._M_elems[0] = 1.79769313486232e+308;
    (box->storage_).coords_min._M_elems[1] = 1.79769313486232e+308;
    (box->storage_).coords_max._M_elems[0] = -1.79769313486232e+308;
    (box->storage_).coords_max._M_elems[1] = -1.79769313486232e+308;
    if (begin._M_current < end._M_current) {
      lVar5 = *(long *)**(undefined8 **)this;
      do {
        lVar6 = (long)*begin._M_current * 0x10 + lVar5;
        lVar7 = 0;
        do {
          dVar2 = *(double *)(lVar6 + lVar7 * 8);
          if (dVar2 < (box->storage_).coords_min._M_elems[lVar7]) {
            (box->storage_).coords_min._M_elems[lVar7] = dVar2;
          }
          dVar2 = *(double *)(lVar6 + lVar7 * 8);
          pdVar1 = (box->storage_).coords_max._M_elems + lVar7;
          if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
            (box->storage_).coords_max._M_elems[lVar7] = dVar2;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 == 1);
        begin._M_current = begin._M_current + 1;
      } while (begin._M_current < end._M_current);
    }
  }
  return pnVar8;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }